

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdCelsiusColorMask::emulate_mthd(MthdCelsiusColorMask *this)

{
  pgraph_state *state;
  uint uVar1;
  uint err;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  err = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c >> 6 & 4 |
        (uint)((uVar1 & 0xfefefefe) != 0);
  if (err != 0) {
    MthdTest::warn((MthdTest *)this,err);
    return;
  }
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    uVar1 = ((uVar1 & 0x10000) << 0xb | (uVar1 & 0x100) << 0x14 | (uVar1 & 1) << 0x1d) +
            (uVar1 & 0x1000000) * 4 |
            (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a &
            0xc3ffffff;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a = uVar1;
    pgraph_celsius_icmd(state,0x1c,uVar1,true);
    return;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t err = 0;
		if (val & ~0x1010101)
			err |= 1;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.bundle_config_a, 29, 1, extr(val, 0, 1));
				insrt(exp.bundle_config_a, 28, 1, extr(val, 8, 1));
				insrt(exp.bundle_config_a, 27, 1, extr(val, 16, 1));
				insrt(exp.bundle_config_a, 26, 1, extr(val, 24, 1));
				pgraph_celsius_icmd(&exp, 0x1c, exp.bundle_config_a, true);
			}
		}
	}